

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_def.c
# Opt level: O2

_Bool upb_MessageDef_MiniDescriptorEncode(upb_MessageDef *m,upb_Arena *a,upb_StringView *out)

{
  google_protobuf_FeatureSet *msg;
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  upb_FieldType uVar4;
  upb_FieldType value_type;
  uint32_t uVar5;
  int iVar6;
  upb_FieldDef *puVar7;
  upb_FieldDef *f;
  uint64_t uVar8;
  uint64_t uVar9;
  upb_FieldDef **ppuVar10;
  upb_OneofDef *o;
  int i;
  byte bVar11;
  int i_00;
  int i_1;
  long lVar12;
  upb_DescState s;
  int32_t ret;
  int32_t default_val;
  
  s.bufsize = 0x20;
  s.buf = (char *)0x0;
  s.ptr = (char *)0x0;
  _Var2 = _upb_DescState_Grow(&s,a);
  if (_Var2) {
    _Var2 = upb_MessageDef_IsMapEntry(m);
    if (_Var2) {
      if (m->field_count != 2) goto LAB_0011e74a;
      i_00 = 0;
      puVar7 = upb_MessageDef_Field(m,0);
      f = upb_MessageDef_Field(m,1);
      if (f == (upb_FieldDef *)0x0 || puVar7 == (upb_FieldDef *)0x0) goto LAB_0011e74c;
      iVar3 = _upb_FieldDef_LayoutIndex(puVar7);
      if (iVar3 != 0) {
        __assert_fail("_upb_FieldDef_LayoutIndex(key_field) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/reflection/message_def.c"
                      ,0x236,
                      "_Bool _upb_MessageDef_EncodeMap(upb_DescState *, const upb_MessageDef *, upb_Arena *)"
                     );
      }
      iVar3 = _upb_FieldDef_LayoutIndex(f);
      pcVar1 = s.ptr;
      if (iVar3 != 1) {
        __assert_fail("_upb_FieldDef_LayoutIndex(val_field) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/reflection/message_def.c"
                      ,0x237,
                      "_Bool _upb_MessageDef_EncodeMap(upb_DescState *, const upb_MessageDef *, upb_Arena *)"
                     );
      }
      uVar4 = upb_FieldDef_Type(puVar7);
      value_type = upb_FieldDef_Type(f);
      uVar8 = _upb_FieldDef_Modifiers(puVar7);
      uVar9 = _upb_FieldDef_Modifiers(f);
      s.ptr = upb_MtDataEncoder_EncodeMap(&s.e,pcVar1,uVar4,value_type,uVar8,uVar9);
    }
    else {
      _Var2 = google_protobuf_MessageOptions_message_set_wire_format(m->opts);
      if (_Var2) {
        s.ptr = upb_MtDataEncoder_EncodeMessageSet(&s.e,s.ptr);
      }
      else {
        if (m->is_sorted == false) {
          ppuVar10 = _upb_FieldDefs_Sorted(m->fields,m->field_count,a);
          if (ppuVar10 == (upb_FieldDef **)0x0) goto LAB_0011e74a;
        }
        else {
          ppuVar10 = (upb_FieldDef **)0x0;
        }
        pcVar1 = s.ptr;
        msg = m->resolved_features;
        default_val = 0;
        _Var2 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                          ((upb_MiniTableField *)&DAT_00134f78,&default_val);
        if ((_Var2) ||
           (_Var2 = upb_Message_HasBaseField
                              (&msg->base_dont_copy_me__upb_internal_use_only,
                               (upb_MiniTableField *)&DAT_00134f78), _Var2)) {
          _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
                    ((upb_MiniTableField *)&DAT_00134f78,&ret,
                     (void *)((long)&msg[2].base_dont_copy_me__upb_internal_use_only.field_0 + 4));
          uVar8 = (uint64_t)((uint)(ret == 1) * 2);
        }
        else {
          uVar8 = 0;
        }
        bVar11 = 0;
        for (iVar3 = 0; iVar3 < m->field_count; iVar3 = iVar3 + 1) {
          puVar7 = upb_MessageDef_Field(m,iVar3);
          _Var2 = _upb_FieldDef_ValidateUtf8(puVar7);
          if (!_Var2) goto LAB_0011e5f6;
          uVar4 = upb_FieldDef_Type(puVar7);
          bVar11 = bVar11 | uVar4 == kUpb_FieldType_String;
        }
        uVar8 = uVar8 | bVar11;
LAB_0011e5f6:
        uVar9 = uVar8 + 4;
        if (m->ext_range_count == 0) {
          uVar9 = uVar8;
        }
        s.ptr = upb_MtDataEncoder_StartMessage(&s.e,pcVar1,uVar9);
        for (lVar12 = 0; lVar12 < m->field_count; lVar12 = lVar12 + 1) {
          if (ppuVar10 == (upb_FieldDef **)0x0) {
            puVar7 = upb_MessageDef_Field(m,(int)lVar12);
          }
          else {
            puVar7 = ppuVar10[lVar12];
          }
          uVar4 = upb_FieldDef_Type(puVar7);
          uVar5 = upb_FieldDef_Number(puVar7);
          uVar8 = _upb_FieldDef_Modifiers(puVar7);
          _Var2 = _upb_DescState_Grow(&s,a);
          if (!_Var2) goto LAB_0011e74a;
          s.ptr = upb_MtDataEncoder_PutField(&s.e,s.ptr,uVar4,uVar5,uVar8);
        }
        for (iVar3 = 0; iVar3 < m->real_oneof_count; iVar3 = iVar3 + 1) {
          _Var2 = _upb_DescState_Grow(&s,a);
          i_00 = 0;
          if (!_Var2) goto LAB_0011e74c;
          s.ptr = upb_MtDataEncoder_StartOneof(&s.e,s.ptr);
          o = upb_MessageDef_Oneof(m,iVar3);
          iVar6 = upb_OneofDef_FieldCount(o);
          if (iVar6 < 1) {
            iVar6 = i_00;
          }
          for (; iVar6 != i_00; i_00 = i_00 + 1) {
            puVar7 = upb_OneofDef_Field(o,i_00);
            uVar5 = upb_FieldDef_Number(puVar7);
            _Var2 = _upb_DescState_Grow(&s,a);
            if (!_Var2) goto LAB_0011e74a;
            s.ptr = upb_MtDataEncoder_PutOneofField(&s.e,s.ptr,uVar5);
          }
        }
      }
    }
    _Var2 = _upb_DescState_Grow(&s,a);
    if (_Var2) {
      *s.ptr = '\0';
      out->data = s.buf;
      out->size = (long)s.ptr - (long)s.buf;
      i_00 = 1;
      goto LAB_0011e74c;
    }
  }
LAB_0011e74a:
  i_00 = 0;
LAB_0011e74c:
  return SUB41(i_00,0);
}

Assistant:

bool upb_MessageDef_MiniDescriptorEncode(const upb_MessageDef* m, upb_Arena* a,
                                         upb_StringView* out) {
  upb_DescState s;
  _upb_DescState_Init(&s);

  if (!_upb_DescState_Grow(&s, a)) return false;

  if (upb_MessageDef_IsMapEntry(m)) {
    if (!_upb_MessageDef_EncodeMap(&s, m, a)) return false;
  } else if (UPB_DESC(MessageOptions_message_set_wire_format)(m->opts)) {
    if (!_upb_MessageDef_EncodeMessageSet(&s, m, a)) return false;
  } else {
    if (!_upb_MessageDef_EncodeMessage(&s, m, a)) return false;
  }

  if (!_upb_DescState_Grow(&s, a)) return false;
  *s.ptr = '\0';

  out->data = s.buf;
  out->size = s.ptr - s.buf;
  return true;
}